

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::IO_Action_PDU::operator==(IO_Action_PDU *this,IO_Action_PDU *Value)

{
  KBOOL KVar1;
  IO_Action_PDU *Value_local;
  IO_Action_PDU *this_local;
  
  KVar1 = IO_Header::operator!=(&this->super_IO_Header,&Value->super_IO_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_RecEntityID,&Value->m_RecEntityID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui32ReqId == Value->m_ui32ReqId) {
      if (this->m_ui16WrTyp == Value->m_ui16WrTyp) {
        if (this->m_ui16SimSrc == Value->m_ui16SimSrc) {
          if (this->m_ui16ActTyp == Value->m_ui16ActTyp) {
            if (this->m_ui16ActPhs == Value->m_ui16ActPhs) {
              KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                                (&this->m_AtkEntityID,&Value->m_AtkEntityID);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else {
                KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                                  (&this->m_TgtEntityID,&Value->m_TgtEntityID);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else if (this->m_ui16NumStdVarRec == Value->m_ui16NumStdVarRec) {
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL IO_Action_PDU::operator == ( const IO_Action_PDU & Value ) const
{
    if( IO_Header::operator !=( Value ) )                 return false;
    if( m_RecEntityID       != Value.m_RecEntityID )      return false;
    if( m_ui32ReqId         != Value.m_ui32ReqId )        return false;
    if( m_ui16WrTyp         != Value.m_ui16WrTyp )        return false;
    if( m_ui16SimSrc        != Value.m_ui16SimSrc )       return false;
    if( m_ui16ActTyp        != Value.m_ui16ActTyp )       return false;
    if( m_ui16ActPhs        != Value.m_ui16ActPhs )       return false;
    if( m_AtkEntityID       != Value.m_AtkEntityID )      return false;
    if( m_TgtEntityID       != Value.m_TgtEntityID )      return false;
    if( m_ui16NumStdVarRec  != Value.m_ui16NumStdVarRec ) return false;
    return true;
}